

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::do_basic_transform
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          collate_impl<wchar_t> *this,level_type level,wchar_t *b,wchar_t *e)

{
  pointer puVar1;
  int iVar2;
  Collator *pCVar3;
  UnicodeString str;
  icu_std_converter<wchar_t,_4> local_60 [2];
  short local_58;
  int local_54;
  
  icu_std_converter<wchar_t,_4>::icu(local_60,(char_type_conflict *)&this->cvt_,b);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (-1 < local_58) {
    local_54 = (int)local_58 >> 5;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,(long)local_54);
  pCVar3 = get_collator(this,level);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = (**(code **)(*(long *)pCVar3 + 0x108))
                    (pCVar3,local_60,puVar1,
                     *(int *)&(__return_storage_ptr__->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (int)puVar1);
  if (*(int *)&(__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
      *(int *)&(__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start < iVar2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,(long)iVar2);
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (**(code **)(*(long *)pCVar3 + 0x108))
              (pCVar3,local_60,puVar1,
               *(int *)&(__return_storage_ptr__->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar1);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,(long)iVar2);
  }
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> do_basic_transform(level_type level,CharType const *b,CharType const *e) const 
                {
                    icu::UnicodeString str=cvt_.icu(b,e);
                    std::vector<uint8_t> tmp;
                    tmp.resize(str.length());
                    icu::Collator *collate = get_collator(level);
                    int len = collate->getSortKey(str,&tmp[0],tmp.size());
                    if(len > int(tmp.size())) {
                        tmp.resize(len);
                        collate->getSortKey(str,&tmp[0],tmp.size());
                    }
                    else 
                        tmp.resize(len);
                    return tmp;
                }